

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphics_robust_access_pass.cpp
# Opt level: O2

void __thiscall
spvtools::opt::GraphicsRobustAccessPass::ClampIndicesForAccessChain
          (GraphicsRobustAccessPass *this,Instruction *access_chain)

{
  uint32_t uVar1;
  uint32_t uVar2;
  int iVar3;
  DefUseManager *pDVar4;
  TypeManager *pTVar5;
  FeatureManager *pFVar6;
  Instruction *pIVar7;
  Instruction *pIVar8;
  Constant *pCVar9;
  undefined4 extraout_var;
  ulong uVar10;
  ConstantManager *constant_mgr;
  long local_2f8;
  TypeManager *type_mgr;
  string local_2e8;
  string local_2c8;
  anon_class_48_6_b48f874a clamp_to_count;
  anon_class_24_3_d10d3925 replace_index;
  anon_class_56_7_7341d3e9 clamp_to_literal_count;
  anon_class_32_4_97c3a017 clamp_index;
  DiagnosticStream local_208;
  
  constant_mgr = IRContext::get_constant_mgr((this->super_Pass).context_);
  pDVar4 = IRContext::get_def_use_mgr((this->super_Pass).context_);
  pTVar5 = IRContext::get_type_mgr((this->super_Pass).context_);
  type_mgr = pTVar5;
  pFVar6 = IRContext::get_feature_mgr((this->super_Pass).context_);
  clamp_to_literal_count.have_int64_cap =
       EnumSet<spv::Capability>::contains(&pFVar6->capabilities_,CapabilityInt64);
  clamp_to_literal_count.replace_index = &replace_index;
  clamp_to_count.clamp_index = &clamp_index;
  clamp_to_count.clamp_to_literal_count = &clamp_to_literal_count;
  clamp_to_count.inst = access_chain;
  clamp_to_count.this = this;
  clamp_to_count.constant_mgr = &constant_mgr;
  clamp_to_count.type_mgr = &type_mgr;
  replace_index.this = this;
  replace_index.inst = access_chain;
  replace_index.def_use_mgr = pDVar4;
  clamp_to_literal_count.inst = access_chain;
  clamp_to_literal_count.this = this;
  clamp_to_literal_count.constant_mgr = &constant_mgr;
  clamp_to_literal_count.type_mgr = &type_mgr;
  clamp_to_literal_count.clamp_index = clamp_to_count.clamp_index;
  clamp_index.inst = access_chain;
  clamp_index.type_mgr = pTVar5;
  clamp_index.this = this;
  clamp_index.replace_index = clamp_to_literal_count.replace_index;
  uVar1 = Instruction::GetSingleWordInOperand(access_chain,0);
  pIVar7 = GetDef(this,uVar1);
  uVar1 = Instruction::type_id(pIVar7);
  pIVar7 = GetDef(this,uVar1);
  uVar1 = Instruction::GetSingleWordInOperand(pIVar7,1);
  pIVar7 = GetDef(this,uVar1);
  local_2f8 = ((long)(access_chain->operands_).
                     super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
              (long)(access_chain->operands_).
                    super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                    ._M_impl.super__Vector_impl_data._M_start) / 0x30;
  uVar1 = 3;
  do {
    if ((this->super_Pass).field_0x35 != '\0') {
      return;
    }
    if ((uint)local_2f8 <= uVar1) {
      return;
    }
    uVar2 = Instruction::GetSingleWordOperand(access_chain,uVar1);
    pIVar8 = GetDef(this,uVar2);
    switch(pIVar7->opcode_) {
    case OpTypeVector:
    case OpTypeMatrix:
      uVar2 = Instruction::GetSingleWordOperand(pIVar7,2);
      ClampIndicesForAccessChain::anon_class_56_7_7341d3e9::operator()
                (&clamp_to_literal_count,uVar1,(ulong)uVar2);
      break;
    default:
      Fail(&local_208,this);
      std::operator<<((ostream *)&local_208," Unhandled pointee type for access chain ");
      Instruction::PrettyPrint_abi_cxx11_(&local_2e8,pIVar7,0x40);
      std::operator<<((ostream *)&local_208,(string *)&local_2e8);
      std::__cxx11::string::_M_dispose();
      DiagnosticStream::~DiagnosticStream(&local_208);
      goto LAB_004f575b;
    case OpTypeArray:
      uVar2 = Instruction::GetSingleWordOperand(pIVar7,2);
      pIVar8 = GetDef(this,uVar2);
      ClampIndicesForAccessChain::anon_class_48_6_b48f874a::operator()(&clamp_to_count,uVar1,pIVar8)
      ;
      break;
    case OpTypeRuntimeArray:
      pIVar8 = MakeRuntimeArrayLengthInst(this,access_chain,uVar1);
      if (pIVar8 == (Instruction *)0x0) {
        return;
      }
      ClampIndicesForAccessChain::anon_class_48_6_b48f874a::operator()(&clamp_to_count,uVar1,pIVar8)
      ;
      if ((this->super_Pass).field_0x35 != '\0') {
        return;
      }
      break;
    case OpTypeStruct:
      if (pIVar8->opcode_ == OpConstant) {
        pCVar9 = analysis::ConstantManager::GetConstantFromInst(constant_mgr,pIVar8);
        iVar3 = (*pCVar9->type_->_vptr_Type[10])();
        if (CONCAT44(extraout_var,iVar3) != 0) {
          uVar2 = Instruction::NumInOperands(pIVar7);
          pCVar9 = analysis::ConstantManager::GetConstantFromInst(constant_mgr,pIVar8);
          uVar10 = analysis::Constant::GetSignExtendedValue(pCVar9);
          if (uVar2 <= uVar10) {
            Fail(&local_208,this);
            std::operator<<((ostream *)&local_208,"Member index ");
            std::ostream::_M_insert<long>((long)&local_208);
            std::operator<<((ostream *)&local_208," is out of bounds for struct type: ");
            Instruction::PrettyPrint_abi_cxx11_(&local_2e8,pIVar7,0x40);
            std::operator<<((ostream *)&local_208,(string *)&local_2e8);
            std::operator<<((ostream *)&local_208,"\nin access chain: ");
            Instruction::PrettyPrint_abi_cxx11_(&local_2c8,access_chain,0x40);
            std::operator<<((ostream *)&local_208,(string *)&local_2c8);
            goto LAB_004f58d4;
          }
          uVar2 = Instruction::GetSingleWordInOperand(pIVar7,(uint32_t)uVar10);
          pIVar7 = GetDef(this,uVar2);
          goto LAB_004f575b;
        }
      }
      Fail(&local_208,this);
      std::operator<<((ostream *)&local_208,"Member index into struct is not a constant integer: ");
      Instruction::PrettyPrint_abi_cxx11_(&local_2e8,pIVar8,0x40);
      std::operator<<((ostream *)&local_208,(string *)&local_2e8);
      std::operator<<((ostream *)&local_208,"\nin access chain: ");
      Instruction::PrettyPrint_abi_cxx11_(&local_2c8,access_chain,0x40);
      std::operator<<((ostream *)&local_208,(string *)&local_2c8);
LAB_004f58d4:
      std::__cxx11::string::_M_dispose();
      std::__cxx11::string::_M_dispose();
      DiagnosticStream::~DiagnosticStream(&local_208);
      return;
    }
    uVar2 = Instruction::GetSingleWordOperand(pIVar7,1);
    pIVar7 = GetDef(this,uVar2);
LAB_004f575b:
    uVar1 = uVar1 + 1;
  } while( true );
}

Assistant:

void GraphicsRobustAccessPass::ClampIndicesForAccessChain(
    Instruction* access_chain) {
  Instruction& inst = *access_chain;

  auto* constant_mgr = context()->get_constant_mgr();
  auto* def_use_mgr = context()->get_def_use_mgr();
  auto* type_mgr = context()->get_type_mgr();
  const bool have_int64_cap =
      context()->get_feature_mgr()->HasCapability(spv::Capability::Int64);

  // Replaces one of the OpAccessChain index operands with a new value.
  // Updates def-use analysis.
  auto replace_index = [this, &inst, def_use_mgr](uint32_t operand_index,
                                                  Instruction* new_value) {
    inst.SetOperand(operand_index, {new_value->result_id()});
    def_use_mgr->AnalyzeInstUse(&inst);
    module_status_.modified = true;
    return SPV_SUCCESS;
  };

  // Replaces one of the OpAccesssChain index operands with a clamped value.
  // Replace the operand at |operand_index| with the value computed from
  // signed_clamp(%old_value, %min_value, %max_value).  It also analyzes
  // the new instruction and records that them module is modified.
  // Assumes %min_value is signed-less-or-equal than %max_value. (All callees
  // use 0 for %min_value).
  auto clamp_index = [&inst, type_mgr, this, &replace_index](
                         uint32_t operand_index, Instruction* old_value,
                         Instruction* min_value, Instruction* max_value) {
    auto* clamp_inst =
        MakeSClampInst(*type_mgr, old_value, min_value, max_value, &inst);
    return replace_index(operand_index, clamp_inst);
  };

  // Ensures the specified index of access chain |inst| has a value that is
  // at most |count| - 1.  If the index is already a constant value less than
  // |count| then no change is made.
  auto clamp_to_literal_count =
      [&inst, this, &constant_mgr, &type_mgr, have_int64_cap, &replace_index,
       &clamp_index](uint32_t operand_index, uint64_t count) -> spv_result_t {
    Instruction* index_inst =
        this->GetDef(inst.GetSingleWordOperand(operand_index));
    const auto* index_type =
        type_mgr->GetType(index_inst->type_id())->AsInteger();
    assert(index_type);
    const auto index_width = index_type->width();

    if (count <= 1) {
      // Replace the index with 0.
      return replace_index(operand_index, GetValueForType(0, index_type));
    }

    uint64_t maxval = count - 1;

    // Compute the bit width of a viable type to hold |maxval|.
    // Look for a bit width, up to 64 bits wide, to fit maxval.
    uint32_t maxval_width = index_width;
    while ((maxval_width < 64) && (0 != (maxval >> maxval_width))) {
      maxval_width *= 2;
    }
    // Determine the type for |maxval|.
    uint32_t next_id = context()->module()->IdBound();
    analysis::Integer signed_type_for_query(maxval_width, true);
    auto* maxval_type =
        type_mgr->GetRegisteredType(&signed_type_for_query)->AsInteger();
    if (next_id != context()->module()->IdBound()) {
      module_status_.modified = true;
    }
    // Access chain indices are treated as signed, so limit the maximum value
    // of the index so it will always be positive for a signed clamp operation.
    maxval = std::min(maxval, ((uint64_t(1) << (maxval_width - 1)) - 1));

    if (index_width > 64) {
      return this->Fail() << "Can't handle indices wider than 64 bits, found "
                             "constant index with "
                          << index_width << " bits as index number "
                          << operand_index << " of access chain "
                          << inst.PrettyPrint();
    }

    // Split into two cases: the current index is a constant, or not.

    // If the index is a constant then |index_constant| will not be a null
    // pointer.  (If index is an |OpConstantNull| then it |index_constant| will
    // not be a null pointer.)  Since access chain indices must be scalar
    // integers, this can't be a spec constant.
    if (auto* index_constant = constant_mgr->GetConstantFromInst(index_inst)) {
      auto* int_index_constant = index_constant->AsIntConstant();
      int64_t value = 0;
      // OpAccessChain indices are treated as signed.  So get the signed
      // constant value here.
      if (index_width <= 32) {
        value = int64_t(int_index_constant->GetS32BitValue());
      } else if (index_width <= 64) {
        value = int_index_constant->GetS64BitValue();
      }
      if (value < 0) {
        return replace_index(operand_index, GetValueForType(0, index_type));
      } else if (uint64_t(value) <= maxval) {
        // Nothing to do.
        return SPV_SUCCESS;
      } else {
        // Replace with maxval.
        assert(count > 0);  // Already took care of this case above.
        return replace_index(operand_index,
                             GetValueForType(maxval, maxval_type));
      }
    } else {
      // Generate a clamp instruction.
      assert(maxval >= 1);
      assert(index_width <= 64);  // Otherwise, already returned above.
      if (index_width >= 64 && !have_int64_cap) {
        // An inconsistent module.
        return Fail() << "Access chain index is wider than 64 bits, but Int64 "
                         "is not declared: "
                      << index_inst->PrettyPrint();
      }
      // Widen the index value if necessary
      if (maxval_width > index_width) {
        // Find the wider type.  We only need this case if a constant array
        // bound is too big.

        // From how we calculated maxval_width, widening won't require adding
        // the Int64 capability.
        assert(have_int64_cap || maxval_width <= 32);
        if (!have_int64_cap && maxval_width >= 64) {
          // Be defensive, but this shouldn't happen.
          return this->Fail()
                 << "Clamping index would require adding Int64 capability. "
                 << "Can't clamp 32-bit index " << operand_index
                 << " of access chain " << inst.PrettyPrint();
        }
        index_inst = WidenInteger(index_type->IsSigned(), maxval_width,
                                  index_inst, &inst);
      }

      // Finally, clamp the index.
      return clamp_index(operand_index, index_inst,
                         GetValueForType(0, maxval_type),
                         GetValueForType(maxval, maxval_type));
    }
    return SPV_SUCCESS;
  };

  // Ensures the specified index of access chain |inst| has a value that is at
  // most the value of |count_inst| minus 1, where |count_inst| is treated as an
  // unsigned integer. This can log a failure.
  auto clamp_to_count = [&inst, this, &constant_mgr, &clamp_to_literal_count,
                         &clamp_index,
                         &type_mgr](uint32_t operand_index,
                                    Instruction* count_inst) -> spv_result_t {
    Instruction* index_inst =
        this->GetDef(inst.GetSingleWordOperand(operand_index));
    const auto* index_type =
        type_mgr->GetType(index_inst->type_id())->AsInteger();
    const auto* count_type =
        type_mgr->GetType(count_inst->type_id())->AsInteger();
    assert(index_type);
    if (const auto* count_constant =
            constant_mgr->GetConstantFromInst(count_inst)) {
      uint64_t value = 0;
      const auto width = count_constant->type()->AsInteger()->width();
      if (width <= 32) {
        value = count_constant->AsIntConstant()->GetU32BitValue();
      } else if (width <= 64) {
        value = count_constant->AsIntConstant()->GetU64BitValue();
      } else {
        return this->Fail() << "Can't handle indices wider than 64 bits, found "
                               "constant index with "
                            << index_type->width() << "bits";
      }
      return clamp_to_literal_count(operand_index, value);
    } else {
      // Widen them to the same width.
      const auto index_width = index_type->width();
      const auto count_width = count_type->width();
      const auto target_width = std::max(index_width, count_width);
      // UConvert requires the result type to have 0 signedness.  So enforce
      // that here.
      auto* wider_type = index_width < count_width ? count_type : index_type;
      if (index_type->width() < target_width) {
        // Access chain indices are treated as signed integers.
        index_inst = WidenInteger(true, target_width, index_inst, &inst);
      } else if (count_type->width() < target_width) {
        // Assume type sizes are treated as unsigned.
        count_inst = WidenInteger(false, target_width, count_inst, &inst);
      }
      // Compute count - 1.
      // It doesn't matter if 1 is signed or unsigned.
      auto* one = GetValueForType(1, wider_type);
      auto* count_minus_1 = InsertInst(
          &inst, spv::Op::OpISub, type_mgr->GetId(wider_type), TakeNextId(),
          {{SPV_OPERAND_TYPE_ID, {count_inst->result_id()}},
           {SPV_OPERAND_TYPE_ID, {one->result_id()}}});
      auto* zero = GetValueForType(0, wider_type);
      // Make sure we clamp to an upper bound that is at most the signed max
      // for the target type.
      const uint64_t max_signed_value =
          ((uint64_t(1) << (target_width - 1)) - 1);
      // Use unsigned-min to ensure that the result is always non-negative.
      // That ensures we satisfy the invariant for SClamp, where the "min"
      // argument we give it (zero), is no larger than the third argument.
      auto* upper_bound =
          MakeUMinInst(*type_mgr, count_minus_1,
                       GetValueForType(max_signed_value, wider_type), &inst);
      // Now clamp the index to this upper bound.
      return clamp_index(operand_index, index_inst, zero, upper_bound);
    }
    return SPV_SUCCESS;
  };

  const Instruction* base_inst = GetDef(inst.GetSingleWordInOperand(0));
  const Instruction* base_type = GetDef(base_inst->type_id());
  Instruction* pointee_type = GetDef(base_type->GetSingleWordInOperand(1));

  // Walk the indices from earliest to latest, replacing indices with a
  // clamped value, and updating the pointee_type.  The order matters for
  // the case when we have to compute the length of a runtime array.  In
  // that the algorithm relies on the fact that that the earlier indices
  // have already been clamped.
  const uint32_t num_operands = inst.NumOperands();
  for (uint32_t idx = 3; !module_status_.failed && idx < num_operands; ++idx) {
    const uint32_t index_id = inst.GetSingleWordOperand(idx);
    Instruction* index_inst = GetDef(index_id);

    switch (pointee_type->opcode()) {
      case spv::Op::OpTypeMatrix:  // Use column count
      case spv::Op::OpTypeVector:  // Use component count
      {
        const uint32_t count = pointee_type->GetSingleWordOperand(2);
        clamp_to_literal_count(idx, count);
        pointee_type = GetDef(pointee_type->GetSingleWordOperand(1));
      } break;

      case spv::Op::OpTypeArray: {
        // The array length can be a spec constant, so go through the general
        // case.
        Instruction* array_len = GetDef(pointee_type->GetSingleWordOperand(2));
        clamp_to_count(idx, array_len);
        pointee_type = GetDef(pointee_type->GetSingleWordOperand(1));
      } break;

      case spv::Op::OpTypeStruct: {
        // SPIR-V requires the index to be an OpConstant.
        // We need to know the index literal value so we can compute the next
        // pointee type.
        if (index_inst->opcode() != spv::Op::OpConstant ||
            !constant_mgr->GetConstantFromInst(index_inst)
                 ->type()
                 ->AsInteger()) {
          Fail() << "Member index into struct is not a constant integer: "
                 << index_inst->PrettyPrint(
                        SPV_BINARY_TO_TEXT_OPTION_FRIENDLY_NAMES)
                 << "\nin access chain: "
                 << inst.PrettyPrint(SPV_BINARY_TO_TEXT_OPTION_FRIENDLY_NAMES);
          return;
        }
        const auto num_members = pointee_type->NumInOperands();
        const auto* index_constant =
            constant_mgr->GetConstantFromInst(index_inst);
        // Get the sign-extended value, since access index is always treated as
        // signed.
        const auto index_value = index_constant->GetSignExtendedValue();
        if (index_value < 0 || index_value >= num_members) {
          Fail() << "Member index " << index_value
                 << " is out of bounds for struct type: "
                 << pointee_type->PrettyPrint(
                        SPV_BINARY_TO_TEXT_OPTION_FRIENDLY_NAMES)
                 << "\nin access chain: "
                 << inst.PrettyPrint(SPV_BINARY_TO_TEXT_OPTION_FRIENDLY_NAMES);
          return;
        }
        pointee_type = GetDef(pointee_type->GetSingleWordInOperand(
            static_cast<uint32_t>(index_value)));
        // No need to clamp this index.  We just checked that it's valid.
      } break;

      case spv::Op::OpTypeRuntimeArray: {
        auto* array_len = MakeRuntimeArrayLengthInst(&inst, idx);
        if (!array_len) {  // We've already signaled an error.
          return;
        }
        clamp_to_count(idx, array_len);
        if (module_status_.failed) return;
        pointee_type = GetDef(pointee_type->GetSingleWordOperand(1));
      } break;

      default:
        Fail() << " Unhandled pointee type for access chain "
               << pointee_type->PrettyPrint(
                      SPV_BINARY_TO_TEXT_OPTION_FRIENDLY_NAMES);
    }
  }
}